

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O3

ssize_t kvtree_write_attempt(char *file,int fd,void *buf,size_t size)

{
  uint __errnum;
  ssize_t sVar1;
  uint *puVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  
  if (size == 0) {
    uVar5 = 0;
  }
  else {
    iVar4 = 10;
    uVar5 = 0;
    do {
      sVar1 = write(fd,(void *)((long)buf + uVar5),size - uVar5);
      if (sVar1 < 1) {
        if (sVar1 == 0) {
          kvtree_err("Error writing file %s write returned 0 @ %s:%d",file,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                     ,0x135);
          return -1;
        }
        puVar2 = (uint *)__errno_location();
        __errnum = *puVar2;
        if ((__errnum != 4) && (__errnum != 0xb)) {
          pcVar3 = strerror(__errnum);
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) {
            kvtree_err("Giving up write of file %s errno=%d %s @ %s:%d",file,(ulong)__errnum,pcVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                       ,0x148);
            return -1;
          }
          kvtree_err("Error writing file %s errno=%d %s @ %s:%d",file,(ulong)__errnum,pcVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                     ,0x143);
        }
      }
      else {
        uVar5 = uVar5 + sVar1;
      }
    } while (uVar5 < size);
  }
  return uVar5;
}

Assistant:

ssize_t kvtree_write_attempt(const char* file, int fd, const void* buf, size_t size)
{
  ssize_t n = 0;
  int retries = 10;
  while (n < size)
  {
    ssize_t rc = write(fd, (char*) buf + n, size - n);
    if (rc > 0) {
      n += rc;
    } else if (rc == 0) {
      /* something bad happened, print an error and abort */
      kvtree_err("Error writing file %s write returned 0 @ %s:%d",
        file, __FILE__, __LINE__
      );
      return -1;
    } else { /* (rc < 0) */
      /* got an error, check whether it was serious */
      if (errno == EINTR || errno == EAGAIN) {
        continue;
      }

      /* something worth printing an error about */
      retries--;
      if (retries) {
        /* print an error and try again */
        kvtree_err("Error writing file %s errno=%d %s @ %s:%d",
          file, errno, strerror(errno), __FILE__, __LINE__
        );
      } else {
        /* too many failed retries, give up */
        kvtree_err("Giving up write of file %s errno=%d %s @ %s:%d",
          file, errno, strerror(errno), __FILE__, __LINE__
        );
        return -1;
      }
    }
  }
  return n;
}